

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  code *unaff_RBX;
  uv_loop_t *stream;
  uv_pipe_t server2;
  uv_pipe_t server1;
  undefined1 auStack_560 [264];
  undefined8 uStack_458;
  uv_pipe_t uStack_448;
  uv_loop_t *puStack_340;
  uv_pipe_t uStack_330;
  uv_loop_t *puStack_228;
  code *pcStack_220;
  undefined1 auStack_218 [264];
  
  stream = (uv_loop_t *)auStack_218;
  loop = (uv_loop_t *)auStack_218;
  pcStack_220 = (code *)0x162305;
  puVar2 = uv_default_loop();
  pcStack_220 = (code *)0x162317;
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&stack0xfffffffffffffef0,0);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffef0;
    pcStack_220 = (code *)0x162333;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar2,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0016241f;
    pcStack_220 = (code *)0x162340;
    puVar2 = uv_default_loop();
    pcStack_220 = (code *)0x16234d;
    iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)auStack_218,0);
    if (iVar1 != 0) goto LAB_00162424;
    pcStack_220 = (code *)0x162364;
    iVar1 = uv_pipe_bind((uv_pipe_t *)auStack_218,"/tmp/uv-test-sock");
    if (iVar1 != -0x62) goto LAB_00162429;
    stream = (uv_loop_t *)&stack0xfffffffffffffef0;
    pcStack_220 = (code *)0x162381;
    iVar1 = uv_listen((uv_stream_t *)stream,0x1000,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0016242e;
    pcStack_220 = (code *)0x162398;
    iVar1 = uv_listen((uv_stream_t *)auStack_218,0x1000,(uv_connection_cb)0x0);
    if (iVar1 != -0x16) goto LAB_00162433;
    unaff_RBX = close_cb;
    pcStack_220 = (code *)0x1623b8;
    uv_close((uv_handle_t *)&stack0xfffffffffffffef0,close_cb);
    pcStack_220 = (code *)0x1623c3;
    uv_close((uv_handle_t *)auStack_218,close_cb);
    pcStack_220 = (code *)0x1623c8;
    loop = uv_default_loop();
    pcStack_220 = (code *)0x1623d2;
    uv_run(loop,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_00162438;
    pcStack_220 = (code *)0x1623e0;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_220 = (code *)0x1623f4;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_220 = (code *)0x1623fe;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    pcStack_220 = (code *)0x162403;
    loop = uv_default_loop();
    pcStack_220 = (code *)0x16240b;
    iVar1 = uv_loop_close(loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_220 = (code *)0x16241f;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_0016241f:
    pcStack_220 = (code *)0x162424;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_00162424:
    stream = puVar2;
    pcStack_220 = (code *)0x162429;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_00162429:
    pcStack_220 = (code *)0x16242e;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_0016242e:
    loop = stream;
    pcStack_220 = (code *)0x162433;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_00162433:
    pcStack_220 = (code *)0x162438;
    run_test_pipe_bind_error_addrinuse_cold_6();
LAB_00162438:
    pcStack_220 = (code *)0x16243d;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  pcStack_220 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (loop != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  puStack_228 = (uv_loop_t *)run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  puStack_340 = (uv_loop_t *)0x162461;
  puStack_228 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_340 = (uv_loop_t *)0x162470;
  iVar1 = uv_pipe_init(puVar2,&uStack_330,0);
  if (iVar1 == 0) {
    puStack_340 = (uv_loop_t *)0x162485;
    iVar1 = uv_pipe_bind(&uStack_330,"/path/to/unix/socket/that/really/should/not/be/there");
    if (iVar1 != -0xd) goto LAB_001624f7;
    puStack_340 = (uv_loop_t *)0x16249b;
    uv_close((uv_handle_t *)&uStack_330,close_cb);
    puStack_340 = (uv_loop_t *)0x1624a0;
    puVar2 = uv_default_loop();
    puStack_340 = (uv_loop_t *)0x1624aa;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001624fc;
    puStack_340 = (uv_loop_t *)0x1624b8;
    unaff_RBX = (code *)uv_default_loop();
    puStack_340 = (uv_loop_t *)0x1624cc;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_340 = (uv_loop_t *)0x1624d6;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puStack_340 = (uv_loop_t *)0x1624db;
    puVar2 = uv_default_loop();
    puStack_340 = (uv_loop_t *)0x1624e3;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_340 = (uv_loop_t *)0x1624f7;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001624f7:
    puStack_340 = (uv_loop_t *)0x1624fc;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001624fc:
    puStack_340 = (uv_loop_t *)0x162501;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_340 = (uv_loop_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  uStack_458._0_4_ = 0x162513;
  uStack_458._4_4_ = 0;
  puStack_340 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  uStack_458._0_4_ = 0x162522;
  uStack_458._4_4_ = 0;
  iVar1 = uv_pipe_init(puVar2,&uStack_448,0);
  if (iVar1 == 0) {
    uStack_458._0_4_ = 0x16253b;
    uStack_458._4_4_ = 0;
    iVar1 = uv_pipe_bind(&uStack_448,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_001625c6;
    uStack_458._0_4_ = 0x162554;
    uStack_458._4_4_ = 0;
    iVar1 = uv_pipe_bind(&uStack_448,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_001625cb;
    uStack_458._0_4_ = 0x16256a;
    uStack_458._4_4_ = 0;
    uv_close((uv_handle_t *)&uStack_448,close_cb);
    uStack_458._0_4_ = 0x16256f;
    uStack_458._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_458._0_4_ = 0x162579;
    uStack_458._4_4_ = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001625d0;
    uStack_458._0_4_ = 0x162587;
    uStack_458._4_4_ = 0;
    unaff_RBX = (code *)uv_default_loop();
    uStack_458._0_4_ = 0x16259b;
    uStack_458._4_4_ = 0;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uStack_458._0_4_ = 0x1625a5;
    uStack_458._4_4_ = 0;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    uStack_458._0_4_ = 0x1625aa;
    uStack_458._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_458._0_4_ = 0x1625b2;
    uStack_458._4_4_ = 0;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    uStack_458._0_4_ = 0x1625c6;
    uStack_458._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001625c6:
    uStack_458._0_4_ = 0x1625cb;
    uStack_458._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001625cb:
    uStack_458._0_4_ = 0x1625d0;
    uStack_458._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001625d0:
    uStack_458._0_4_ = 0x1625d5;
    uStack_458._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_4();
  }
  uStack_458 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  uStack_458 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)auStack_560,0);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)auStack_560;
    iVar1 = uv_listen((uv_stream_t *)puVar2,0x1000,(uv_connection_cb)0x0);
    if (iVar1 != -0x16) goto LAB_0016267d;
    uv_close((uv_handle_t *)auStack_560,close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162687;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_0016267d:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_00162687:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT(r == UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}